

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

aiReturn aiDetachLogStream(aiLogStream *stream)

{
  bool bVar1;
  Logger *pLVar2;
  pointer ppVar3;
  int __sig;
  __pid_t __pid;
  _Self local_38 [3];
  _Self local_20;
  iterator it;
  aiLogStream *stream_local;
  _Self _Var4;
  
  it._M_node = (_Base_ptr)stream;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
       ::find((map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
               *)Assimp::gActiveLogStreams,stream);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
       ::end((map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
              *)Assimp::gActiveLogStreams);
  bVar1 = std::operator==(&local_20,local_38);
  if (bVar1) {
    stream_local._4_4_ = aiReturn_FAILURE;
  }
  else {
    pLVar2 = Assimp::DefaultLogger::get();
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>::operator->
                       (&local_20);
    (*pLVar2->_vptr_Logger[3])(pLVar2,ppVar3->second,0xf);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>::operator->
                       (&local_20);
    if (ppVar3->second != (LogStream *)0x0) {
      (*ppVar3->second->_vptr_LogStream[1])();
    }
    _Var4._M_node = local_20._M_node;
    std::
    map<aiLogStream,Assimp::LogStream*,Assimp::mpred,std::allocator<std::pair<aiLogStream_const,Assimp::LogStream*>>>
    ::erase_abi_cxx11_((map<aiLogStream,Assimp::LogStream*,Assimp::mpred,std::allocator<std::pair<aiLogStream_const,Assimp::LogStream*>>>
                        *)Assimp::gActiveLogStreams,(iterator)local_20._M_node);
    __sig = (int)_Var4._M_node;
    __pid = 0x1120dc8;
    bVar1 = std::
            map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
            ::empty((map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
                     *)Assimp::gActiveLogStreams);
    if (bVar1) {
      Assimp::DefaultLogger::kill(__pid,__sig);
    }
    stream_local._4_4_ = aiReturn_SUCCESS;
  }
  return stream_local._4_4_;
}

Assistant:

ASSIMP_API aiReturn aiDetachLogStream( const aiLogStream* stream)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();

#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
    // find the log-stream associated with this data
    LogStreamMap::iterator it = gActiveLogStreams.find( *stream);
    // it should be there... else the user is playing fools with us
    if( it == gActiveLogStreams.end())  {
        return AI_FAILURE;
    }
    DefaultLogger::get()->detatchStream( it->second );
    delete it->second;

    gActiveLogStreams.erase( it);

    if (gActiveLogStreams.empty()) {
        DefaultLogger::kill();
    }
    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_SUCCESS;
}